

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::disconnect(CommonCore *this)

{
  milliseconds msToWait;
  bool bVar1;
  GlobalBrokerId GVar2;
  CommonCore *in_RDI;
  __sv_type _Var3;
  int cnt;
  ActionMessage udisconnect;
  ActionMessage *in_stack_fffffffffffffe58;
  BrokerBase *in_stack_fffffffffffffe60;
  ostream *in_stack_fffffffffffffe68;
  CommonCore *in_stack_fffffffffffffe70;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  undefined4 in_stack_fffffffffffffe78;
  action_t in_stack_fffffffffffffe7c;
  ActionMessage *in_stack_fffffffffffffe80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  BrokerBase *pBStack_148;
  GlobalFederateId local_12c [2];
  BrokerState in_stack_fffffffffffffede;
  ActionMessage *local_108;
  BrokerBase *pBStack_100;
  GlobalFederateId local_e0;
  int local_dc;
  duration<long,std::ratio<1l,1000l>> local_d8 [8];
  int local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [3];
  undefined1 in_stack_ffffffffffffffbb;
  int in_stack_ffffffffffffffbc;
  BrokerBase *in_stack_ffffffffffffffc0;
  string_view in_stack_ffffffffffffffc8;
  GlobalFederateId in_stack_ffffffffffffffdc;
  
  __rhs = local_c0;
  ActionMessage::ActionMessage(in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
  BrokerBase::addActionMessage(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  local_d0 = 0;
  do {
    local_dc = 200;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_d8,&local_dc);
    msToWait.__r._4_4_ = in_stack_fffffffffffffe7c;
    msToWait.__r._0_4_ = in_stack_fffffffffffffe78;
    bVar1 = waitForDisconnect(in_stack_fffffffffffffe70,msToWait);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_00531733:
      ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffe60);
      return;
    }
    local_d0 = local_d0 + 1;
    GVar2 = CLI::std::atomic<helics::GlobalBrokerId>::load
                      (&(in_RDI->super_BrokerBase).global_id,seq_cst);
    GlobalFederateId::GlobalFederateId(&local_e0,GVar2);
    getIdentifier_abi_cxx11_(in_RDI);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe60);
    BrokerBase::getBrokerState((BrokerBase *)0x531522);
    brokerStateName_abi_cxx11_(in_stack_fffffffffffffede);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),__rhs);
    _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffe60);
    local_108 = (ActionMessage *)_Var3._M_len;
    pBStack_100 = (BrokerBase *)_Var3._M_str;
    BrokerBase::sendToLogger
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffc8,(string_view)udisconnect._24_16_,
               (bool)in_stack_ffffffffffffffbb);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pBStack_100);
    in_stack_fffffffffffffe60 = pBStack_100;
    if (local_d0 % 4 == 0) {
      bVar1 = BrokerBase::isRunning((BrokerBase *)0x5315e1);
      in_stack_fffffffffffffe7c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe7c);
      if (!bVar1) {
        this_00 = (basic_string_view<char,_std::char_traits<char>_> *)&in_RDI->super_BrokerBase;
        GVar2 = CLI::std::atomic<helics::GlobalBrokerId>::load
                          (&(in_RDI->super_BrokerBase).global_id,seq_cst);
        GlobalFederateId::GlobalFederateId(local_12c,GVar2);
        getIdentifier_abi_cxx11_(in_RDI);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pBStack_100)
        ;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (this_00,(char *)in_stack_fffffffffffffe68);
        BrokerBase::sendToLogger
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffbc,
                   in_stack_ffffffffffffffc8,(string_view)udisconnect._24_16_,
                   (bool)in_stack_ffffffffffffffbb);
        in_stack_fffffffffffffe60 = pBStack_148;
        goto LAB_00531733;
      }
      BrokerBase::addActionMessage(pBStack_100,local_108);
      in_stack_fffffffffffffe60 = pBStack_100;
    }
    if (local_d0 % 0xd == 0) {
      in_stack_fffffffffffffe68 = std::operator<<((ostream *)&std::cerr,"waiting on disconnect ");
      std::ostream::operator<<(in_stack_fffffffffffffe68,std::endl<char,std::char_traits<char>>);
    }
  } while( true );
}

Assistant:

void CommonCore::disconnect()
{
    const ActionMessage udisconnect(CMD_USER_DISCONNECT);
    addActionMessage(udisconnect);
    int cnt{0};
    while (!waitForDisconnect(std::chrono::milliseconds(200))) {
        ++cnt;
        LOG_WARNING(global_id.load(),
                    getIdentifier(),
                    "waiting on disconnect: current state=" + brokerStateName(getBrokerState()));
        if (cnt % 4 == 0) {
            if (!isRunning()) {
                LOG_WARNING(
                    global_id.load(),
                    getIdentifier(),
                    "main loop is stopped but have not received disconnect notice, assuming disconnected");
                return;
            }
            addActionMessage(udisconnect);
        }
        if (cnt % 13 == 0) {
            std::cerr << "waiting on disconnect " << std::endl;
        }
    }
}